

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

void Aig_ConeCleanAndMark_rec(Aig_Obj_t *pObj)

{
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x285,"void Aig_ConeCleanAndMark_rec(Aig_Obj_t *)");
  }
  if (((*(uint *)&pObj->field_0x18 & 0x10) == 0) && ((*(uint *)&pObj->field_0x18 & 7) - 5 < 2)) {
    Aig_ConeCleanAndMark_rec((Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Aig_ConeCleanAndMark_rec((Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    if ((*(ulong *)&pObj->field_0x18 & 0x10) != 0) {
      __assert_fail("!Aig_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0x28a,"void Aig_ConeCleanAndMark_rec(Aig_Obj_t *)");
    }
    *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 | 0x10;
    (pObj->field_5).pData = (void *)0x0;
  }
  return;
}

Assistant:

void Aig_ConeCleanAndMark_rec( Aig_Obj_t * pObj )
{
    assert( !Aig_IsComplement(pObj) );
    if ( !Aig_ObjIsNode(pObj) || Aig_ObjIsMarkA(pObj) )
        return;
    Aig_ConeCleanAndMark_rec( Aig_ObjFanin0(pObj) );
    Aig_ConeCleanAndMark_rec( Aig_ObjFanin1(pObj) );
    assert( !Aig_ObjIsMarkA(pObj) ); // loop detection
    Aig_ObjSetMarkA( pObj );
    pObj->pData = NULL;
}